

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

void __thiscall kws::Parser::GenerateFixedFile(Parser *this)

{
  char cVar1;
  ostream *poVar2;
  allocator local_249;
  string filename;
  string local_228;
  ofstream file;
  
  if (this->m_FixFile == true) {
    if ((this->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No error. Not generating corrected file.");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    std::__cxx11::string::string
              ((string *)&file,(this->m_Filename)._M_dataplus._M_p,(allocator *)&local_228);
    kwssys::SystemTools::GetFilenameWithoutExtension(&filename,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::append((char *)&filename);
    std::__cxx11::string::string
              ((string *)&local_228,(this->m_Filename)._M_dataplus._M_p,&local_249);
    kwssys::SystemTools::GetFilenameExtension((string *)&file,&local_228);
    std::__cxx11::string::append((string *)&filename);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&local_228);
    poVar2 = std::operator<<((ostream *)&std::cout,"Generating corrected file: ");
    poVar2 = std::operator<<(poVar2,filename._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::ofstream(&file);
    std::ofstream::open((char *)&file,(_Ios_Openmode)filename._M_dataplus._M_p);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      std::operator<<((ostream *)&file,(string *)&this->m_FixedBuffer);
      std::ofstream::close();
    }
    std::ofstream::~ofstream(&file);
    std::__cxx11::string::~string((string *)&filename);
  }
  return;
}

Assistant:

void Parser::GenerateFixedFile()
{
  if(!this->m_FixFile)
    {
    return;
    }

    if (m_ErrorList.empty()) {
      std::cout << "No error. Not generating corrected file." << std::endl;
      return;
    }

  std::string filename = kwssys::SystemTools::GetFilenameWithoutExtension(m_Filename.c_str());
  filename += ".fixed";
  filename += kwssys::SystemTools::GetFilenameExtension(m_Filename.c_str());

  std::cout << "Generating corrected file: " << filename.c_str() << std::endl;

  std::ofstream file;
  file.open(filename.c_str(), std::ios::binary | std::ios::out);
  if(!file.is_open())
    {
    std::cout << "Cannot open file for writing: " <<  std::endl;
    return;
    }

  file << this->m_FixedBuffer;

  file.close();
}